

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ArrayFeatureType::SerializeWithCachedSizes
          (ArrayFeatureType *this,CodedOutputStream *output)

{
  uint32 uVar1;
  uint64 value;
  int index;
  int iVar2;
  
  iVar2 = (this->shape_).current_size_;
  if (0 < iVar2) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,10);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_shape_cached_byte_size_);
    iVar2 = (this->shape_).current_size_;
  }
  index = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
    index = 0;
  }
  for (; iVar2 != index; index = index + 1) {
    value = shape(this,index);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,value);
  }
  if (this->datatype_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(2,this->datatype_,output);
  }
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 0x15) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x15,&((this->ShapeFlexibility_).enumeratedshapes_)->super_MessageLite,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x1f) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x1f,&((this->ShapeFlexibility_).enumeratedshapes_)->super_MessageLite,output);
  }
  uVar1 = this->_oneof_case_[1];
  if (uVar1 == 0x29) {
    google::protobuf::internal::WireFormatLite::WriteInt32
              (0x29,(this->defaultOptionalValue_).intdefaultvalue_,output);
    uVar1 = this->_oneof_case_[1];
  }
  if (uVar1 == 0x33) {
    google::protobuf::internal::WireFormatLite::WriteFloat
              (0x33,(this->defaultOptionalValue_).floatdefaultvalue_,output);
    uVar1 = this->_oneof_case_[1];
  }
  if (uVar1 == 0x3d) {
    google::protobuf::internal::WireFormatLite::WriteDouble
              (0x3d,(this->defaultOptionalValue_).doubledefaultvalue_,output);
    return;
  }
  return;
}

Assistant:

void ArrayFeatureType::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ArrayFeatureType)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 shape = 1;
  if (this->shape_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_shape_cached_byte_size_);
  }
  for (int i = 0, n = this->shape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->shape(i), output);
  }

  // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
  if (this->datatype() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      2, this->datatype(), output);
  }

  // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
  if (has_enumeratedshapes()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      21, *ShapeFlexibility_.enumeratedshapes_, output);
  }

  // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
  if (has_shaperange()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      31, *ShapeFlexibility_.shaperange_, output);
  }

  // int32 intDefaultValue = 41;
  if (has_intdefaultvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(41, this->intdefaultvalue(), output);
  }

  // float floatDefaultValue = 51;
  if (has_floatdefaultvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(51, this->floatdefaultvalue(), output);
  }

  // double doubleDefaultValue = 61;
  if (has_doubledefaultvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(61, this->doubledefaultvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ArrayFeatureType)
}